

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

int main(void)

{
  Timer timer;
  Loop loop;
  _Any_data local_468;
  code *local_458;
  code *local_450;
  Timer local_440;
  Loop local_368;
  
  local_440.super_Handle<uv_timer_s>.handle_.data = &local_440;
  local_440.super_Handle<uv_timer_s>.closeHandler_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_440.super_Handle<uv_timer_s>.closeHandler_.super__Function_base._M_functor._8_8_ = 0;
  local_440.super_Handle<uv_timer_s>.closeHandler_._M_invoker =
       std::
       _Function_handler<void_(),_uv::Handle<uv_timer_s>::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/../include/uv++/Handle.hpp:28:41)>
       ::_M_invoke;
  local_440.super_Handle<uv_timer_s>.closeHandler_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_uv::Handle<uv_timer_s>::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/../include/uv++/Handle.hpp:28:41)>
       ::_M_manager;
  local_440.startHandler_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_440.startHandler_.super__Function_base._M_functor._8_8_ = 0;
  local_440.startHandler_._M_invoker =
       std::
       _Function_handler<void_(),_uv::Timer::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/../include/uv++/Timer.hpp:30:48)>
       ::_M_invoke;
  local_440.startHandler_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_uv::Timer::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/../include/uv++/Timer.hpp:30:48)>
       ::_M_manager;
  uv::Loop::init(&local_368,(EVP_PKEY_CTX *)0x0);
  uv::Timer::init(&local_440,(EVP_PKEY_CTX *)&local_368);
  local_468._M_unused._M_object = (void *)0x0;
  local_468._8_8_ = 0;
  local_450 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/timer.cpp:13:15)>
              ::_M_invoke;
  local_458 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/feihongmeilian[P]uv/samples/timer.cpp:13:15)>
              ::_M_manager;
  uv::Timer::start(&local_440,(function<void_()> *)&local_468,1000,1000);
  std::_Function_base::~_Function_base((_Function_base *)&local_468);
  uv::Loop::run(&local_368);
  uv::Timer::~Timer(&local_440);
  uv::Loop::~Loop(&local_368);
  return 0;
}

Assistant:

int main()
{
	uv::Loop loop;
	uv::Timer timer;

	try {
		loop.init();
		timer.init(loop);

		timer.start([]() {
			std::cout << "Hello,World" << std::endl;
		}, 1000, 1000);

		loop.run();
	}
	catch (const uv::Exception &ex) {
		std::cout << ex.what() << std::endl;
	}
}